

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
          (iterator *__return_storage_ptr__,void *this,QString *key,QDomNodePrivate **args)

{
  QDomNodePrivate *pQVar1;
  long in_FS_OFFSET;
  QMultiHash<QString,_QDomNodePrivate_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *this;
  if (pQVar1 == (QDomNodePrivate *)0x0) {
    local_38.d = (Data *)0x0;
    local_38.m_size = *(qsizetype *)((long)this + 8);
LAB_001187d3:
    QMultiHash<QString,_QDomNodePrivate_*>::detach((QMultiHash<QString,_QDomNodePrivate_*> *)this);
    emplace_helper<QDomNodePrivate*const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<QString,_QDomNodePrivate_*>::~QMultiHash(&local_38);
  }
  else {
    if (1 < *(uint *)&pQVar1->_vptr_QDomNodePrivate) {
      local_38.m_size = *(qsizetype *)((long)this + 8);
      local_38.d = (Data *)pQVar1;
      if (*(int *)&pQVar1->_vptr_QDomNodePrivate != -1) {
        LOCK();
        *(int *)&pQVar1->_vptr_QDomNodePrivate = *(int *)&pQVar1->_vptr_QDomNodePrivate + 1;
        UNLOCK();
      }
      goto LAB_001187d3;
    }
    if (*(ulong *)&pQVar1->ref < (ulong)pQVar1->prev >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        emplace_helper<QDomNodePrivate*const&>(__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_0011882c;
    }
    local_38.d = (Data *)*args;
    emplace_helper<QDomNodePrivate*>(__return_storage_ptr__,this,key,(QDomNodePrivate **)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_0011882c:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }